

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

void __thiscall v_array<feature_slice>::delete_v(v_array<feature_slice> *this)

{
  feature_slice *pfVar1;
  
  pfVar1 = this->_begin;
  if (pfVar1 != (feature_slice *)0x0) {
    for (; pfVar1 != this->_end; pfVar1 = pfVar1 + 1) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&pfVar1->space_name);
    }
    free(this->_begin);
  }
  this->_begin = (feature_slice *)0x0;
  this->_end = (feature_slice *)0x0;
  this->end_array = (feature_slice *)0x0;
  return;
}

Assistant:

void delete_v()
  {
    if (_begin != nullptr)
    {
      for (T* item = _begin; item != _end; ++item) item->~T();
      free(_begin);
    }
    _begin = _end = end_array = nullptr;
  }